

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxOut::ElementsDecodeRawTransactionTxOut
          (ElementsDecodeRawTransactionTxOut *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_46;
  allocator local_45;
  allocator local_44;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  string *local_40;
  string *local_38;
  
  (this->super_JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionTxOut>)._vptr_JsonClassBase
       = (_func_int **)&PTR__ElementsDecodeRawTransactionTxOut_006566e0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->value_ = 0;
  this->value_minimum_ = 0;
  this->value_maximum_ = 0;
  this->ct_exponent_ = 0;
  this->ct_bits_ = 0;
  std::__cxx11::string::string((string *)&this->surjectionproof_,"",&local_41);
  local_38 = &this->surjectionproof_;
  std::__cxx11::string::string((string *)&this->valuecommitment_,"",&local_42);
  local_40 = &this->valuecommitment_;
  std::__cxx11::string::string((string *)&this->asset_,"",&local_43);
  std::__cxx11::string::string((string *)&this->assetcommitment_,"",&local_44);
  std::__cxx11::string::string((string *)&this->commitmentnonce_,"",&local_45);
  this->commitmentnonce_fully_valid_ = false;
  this->n_ = 0;
  ElementsDecodeLockingScript::ElementsDecodeLockingScript(&this->script_pub_key_);
  std::__cxx11::string::string((string *)&this->rangeproof_,"",&local_46);
  CollectFieldName();
  return;
}

Assistant:

ElementsDecodeRawTransactionTxOut() {
    CollectFieldName();
  }